

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenStringConcatSetLeft(BinaryenExpressionRef expr,BinaryenExpressionRef leftExpr)

{
  if (expr->_id != StringConcatId) {
    __assert_fail("expression->is<StringConcat>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x1230,
                  "void BinaryenStringConcatSetLeft(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (leftExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 1) = leftExpr;
    return;
  }
  __assert_fail("leftExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x1231,
                "void BinaryenStringConcatSetLeft(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenStringConcatSetLeft(BinaryenExpressionRef expr,
                                 BinaryenExpressionRef leftExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<StringConcat>());
  assert(leftExpr);
  static_cast<StringConcat*>(expression)->left = (Expression*)leftExpr;
}